

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::record::InterpolationBase::InterpolationBase
          (InterpolationBase *this,double C1,double C2,long L1,long L2,
          vector<long,_std::allocator<long>_> *boundaryIndices,
          vector<long,_std::allocator<long>_> *interpolationSchemeIndices)

{
  pointer plVar1;
  pointer plVar2;
  
  plVar1 = (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(long *)&(this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long> = plVar2[-1];
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Tuple_impl<4UL,_long,_long> + 8))->_M_head_impl = (long)plVar2 - (long)plVar1 >> 3;
  (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = L2;
  (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       L1;
  (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = C2;
  (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = C1;
  (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = plVar1;
  (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = plVar2;
  (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  plVar1 = (interpolationSchemeIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (interpolationSchemeIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = plVar1;
  (this->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (interpolationSchemeIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (interpolationSchemeIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (interpolationSchemeIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (interpolationSchemeIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  verifyVectorSizes(&this->boundaryIndices,&this->interpolationSchemeIndices);
  verifyBoundaryIndicesAreSorted(&this->boundaryIndices);
  return;
}

Assistant:

InterpolationBase
( double C1, double C2, long L1, long L2,
  std::vector< long >&& boundaryIndices,
  std::vector< long >&& interpolationSchemeIndices ) :
  metadata( C1, C2, L1, L2, boundaryIndices.size(), boundaryIndices.back() ),
  boundaryIndices( std::move(boundaryIndices) ),
  interpolationSchemeIndices( std::move(interpolationSchemeIndices) ) {
  verifyVectorSizes( this->boundaryIndices, this->interpolationSchemeIndices );
  verifyBoundaryIndicesAreSorted( this->boundaryIndices );
}